

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprogressbar.cpp
# Opt level: O3

QString * __thiscall QProgressBar::text(QString *__return_storage_ptr__,QProgressBar *this)

{
  int iVar1;
  long lVar2;
  Data *pDVar3;
  uint uVar4;
  long in_FS_OFFSET;
  QLatin1String QVar5;
  QLatin1String QVar6;
  QLatin1String QVar7;
  QLocale locale;
  QArrayData *local_58 [3];
  QLocale local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *(long *)&(this->super_QWidget).field_0x8;
  iVar1 = *(int *)(lVar2 + 0x254);
  if (((*(int *)(lVar2 + 600) == 0 && iVar1 == 0) || (*(int *)(lVar2 + 0x25c) < iVar1)) ||
     (iVar1 == -0x80000000 && *(int *)(lVar2 + 0x25c) == -0x80000000)) {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_004699ad;
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    pDVar3 = *(Data **)(lVar2 + 0x278);
    (__return_storage_ptr__->d).d = pDVar3;
    (__return_storage_ptr__->d).ptr = *(char16_t **)(lVar2 + 0x280);
    (__return_storage_ptr__->d).size = *(qsizetype *)(lVar2 + 0x288);
    if (pDVar3 != (Data *)0x0) {
      LOCK();
      (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_40 = (QLocale)&DAT_aaaaaaaaaaaaaaaa;
    QLocale::QLocale(&local_40,(QLocale *)(lVar2 + 0x210));
    uVar4 = QLocale::numberOptions();
    QLocale::setNumberOptions(&local_40,uVar4 | 1);
    QLocale::toString((longlong)local_58);
    QVar5.m_data = (char *)0x2;
    QVar5.m_size = (qsizetype)__return_storage_ptr__;
    QString::replace(QVar5,(QString *)"%m",(CaseSensitivity)local_58);
    if (local_58[0] != (QArrayData *)0x0) {
      LOCK();
      (local_58[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_58[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_58[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_58[0],2,0x10);
      }
    }
    QLocale::toString((longlong)local_58);
    QVar6.m_data = (char *)0x2;
    QVar6.m_size = (qsizetype)__return_storage_ptr__;
    QString::replace(QVar6,(QString *)"%v",(CaseSensitivity)local_58);
    if (local_58[0] != (QArrayData *)0x0) {
      LOCK();
      (local_58[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_58[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_58[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_58[0],2,0x10);
      }
    }
    QLocale::toString((longlong)local_58);
    QVar7.m_data = (char *)0x2;
    QVar7.m_size = (qsizetype)__return_storage_ptr__;
    QString::replace(QVar7,(QString *)0x6f3e96,(CaseSensitivity)local_58);
    if (local_58[0] != (QArrayData *)0x0) {
      LOCK();
      (local_58[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_58[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_58[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_58[0],2,0x10);
      }
    }
    QLocale::~QLocale(&local_40);
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
LAB_004699ad:
      __stack_chk_fail();
    }
  }
  return __return_storage_ptr__;
}

Assistant:

QString QProgressBar::text() const
{
    Q_D(const QProgressBar);
    if ((d->maximum == 0 && d->minimum == 0) || d->value < d->minimum
            || (d->value == INT_MIN && d->minimum == INT_MIN))
        return QString();

    qint64 totalSteps = qint64(d->maximum) - d->minimum;

    QString result = d->format;
    QLocale locale = d->locale; // Omit group separators for compatibility with previous versions that were non-localized.
    locale.setNumberOptions(locale.numberOptions() | QLocale::OmitGroupSeparator);
    result.replace("%m"_L1, locale.toString(totalSteps));
    result.replace("%v"_L1, locale.toString(d->value));

    // If max and min are equal and we get this far, it means that the
    // progress bar has one step and that we are on that step. Return
    // 100% here in order to avoid division by zero further down.
    if (totalSteps == 0) {
        result.replace("%p"_L1, locale.toString(100));
        return result;
    }

    const auto progress = static_cast<int>((qint64(d->value) - d->minimum) * 100.0 / totalSteps);
    result.replace("%p"_L1, locale.toString(progress));
    return result;
}